

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

SquareMatrix<4> * pbrt::Transpose<4>(SquareMatrix<4> *__return_storage_ptr__,SquareMatrix<4> *m)

{
  int i;
  long lVar1;
  Float (*paFVar2) [4];
  long lVar3;
  
  SquareMatrix<4>::SquareMatrix(__return_storage_ptr__);
  paFVar2 = (Float (*) [4])__return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 4) {
      *(Float *)((long)*(Float (*) [4])*paFVar2 + lVar3) = *(Float *)((long)m + lVar3 * 4);
    }
    m = (SquareMatrix<4> *)((long)m + 4);
    paFVar2 = paFVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU inline SquareMatrix<N> Transpose(const SquareMatrix<N> &m) {
    SquareMatrix<N> r;
    for (int i = 0; i < N; ++i)
        for (int j = 0; j < N; ++j)
            r[i][j] = m[j][i];
    return r;
}